

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_parser.cpp
# Opt level: O1

CheckedError __thiscall
flatbuffers::Parser::ParseProtoFields
          (Parser *this,StructDef *struct_def,bool isextend,bool inside_oneof)

{
  size_type *input;
  _Base_ptr p_Var1;
  iterator iVar2;
  size_type sVar3;
  FieldDef *__rhs;
  StructDef *pSVar4;
  undefined8 uVar5;
  bool bVar6;
  bool bVar7;
  BaseType BVar8;
  BaseType BVar9;
  undefined4 uVar10;
  int iVar11;
  ulong *puVar12;
  long lVar13;
  undefined8 *puVar14;
  const_iterator cVar15;
  Value *e;
  Parser *pPVar16;
  EnumVal *pEVar17;
  long *plVar18;
  undefined7 in_register_00000009;
  string *psVar19;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar20;
  undefined7 in_register_00000011;
  CheckedError *ce;
  char cVar21;
  int t;
  undefined4 in_R8D;
  undefined2 uVar22;
  unsigned_short uVar23;
  ulong *puVar24;
  pointer ppFVar25;
  byte bVar26;
  bool bVar27;
  bool bVar28;
  string val;
  FieldDef *field;
  voffset_t attribute;
  string name;
  EnumDef *oneof_union;
  StructDef *anonymous_struct;
  string proto_field_id;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> name_1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  field_comment;
  undefined1 local_2c0 [16];
  undefined1 local_2b0 [24];
  FieldDef *local_298;
  undefined2 uStack_290;
  undefined6 uStack_28e;
  undefined2 uStack_288;
  undefined6 uStack_286;
  undefined1 auStack_280 [8];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_278;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_268;
  string *local_258;
  EnumDef *local_250;
  _Base_ptr local_248;
  undefined4 local_240;
  undefined4 local_23c;
  undefined1 local_238 [32];
  pointer local_218;
  pointer local_210;
  undefined1 local_208 [32];
  _Base_ptr local_1e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1e0;
  undefined1 local_1d0 [48];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a0;
  pointer local_190;
  __uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  _Stack_188;
  pointer local_180;
  _Rb_tree_node_base local_170;
  size_t local_150;
  pointer ppSStack_148;
  pointer local_140;
  pointer ppSStack_138;
  bool local_130;
  Namespace *local_128;
  uoffset_t local_120;
  undefined8 local_11c;
  string *local_110;
  undefined1 local_100 [24];
  _Base_ptr local_e8;
  size_t local_e0;
  pointer ppFStack_d8;
  pointer local_d0;
  pointer ppFStack_c8;
  bool local_c0;
  undefined2 local_bf;
  bool local_bd;
  size_t local_b8;
  uint8_t *local_b0;
  __uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  _Stack_a8;
  pointer local_a0;
  pointer puStack_98;
  pointer local_90;
  _Base_ptr local_88;
  _Base_ptr local_80;
  size_type *local_78;
  pointer *local_70;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_258 = (string *)CONCAT71(in_register_00000011,isextend);
  local_240 = (undefined4)CONCAT71(in_register_00000009,inside_oneof);
  t = (int)struct_def;
  local_23c = in_R8D;
  Expect(this,t);
  *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
  if (*(char *)&(this->super_ParserState).prev_cursor_ != '\0') {
LAB_0011dd59:
    return SUB82(this,0);
  }
  input = &(struct_def->super_Definition).file._M_string_length;
  local_70 = &(struct_def->super_Definition).doc_comment.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
  local_78 = &local_258[6]._M_string_length;
  local_80 = (_Base_ptr)&local_258[6].field_2;
  local_88 = (_Base_ptr)(local_1d0 + 0xd0);
  local_208._16_8_ = &local_258[9].field_2;
LAB_0011ddcd:
  iVar11 = *(int *)((long)&(struct_def->super_Definition).name.field_2 + 0xc);
  if (iVar11 == 0x104) {
    iVar11 = std::__cxx11::string::compare((char *)input);
    if (iVar11 != 0) goto LAB_0011ddfb;
LAB_0011df04:
    ParseProtoDecl(this);
  }
  else {
    if (iVar11 == 0x7d) {
      Next(this);
      *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
      if (*(char *)&(this->super_ParserState).prev_cursor_ == '\0') {
        *(undefined2 *)&(this->super_ParserState).prev_cursor_ = 0;
      }
      goto LAB_0011dd59;
    }
LAB_0011ddfb:
    if (((*(int *)((long)&(struct_def->super_Definition).name.field_2 + 0xc) == 0x104) &&
        (iVar11 = std::__cxx11::string::compare((char *)input), iVar11 == 0)) ||
       ((*(int *)((long)&(struct_def->super_Definition).name.field_2 + 0xc) == 0x104 &&
        (iVar11 = std::__cxx11::string::compare((char *)input), iVar11 == 0)))) goto LAB_0011df04;
    if ((*(int *)((long)&(struct_def->super_Definition).name.field_2 + 0xc) == 0x104) &&
       (iVar11 = std::__cxx11::string::compare((char *)input), iVar11 == 0)) {
      Next(this);
      *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
      if (*(char *)&(this->super_ParserState).prev_cursor_ == '\0') {
        Expect(this,t);
        *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
        if (*(char *)&(this->super_ParserState).prev_cursor_ == '\0') {
          if (*(int *)((long)&(struct_def->super_Definition).name.field_2 + 0xc) != 0x104) {
LAB_0011e050:
            Expect(this,t);
            goto LAB_0011e4f2;
          }
          Next(this);
          *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
          if (*(char *)&(this->super_ParserState).prev_cursor_ == '\0') {
            Next(this);
            goto LAB_0011e043;
          }
        }
      }
      goto LAB_0011dd59;
    }
    if ((*(int *)((long)&(struct_def->super_Definition).name.field_2 + 0xc) == 0x104) &&
       (iVar11 = std::__cxx11::string::compare((char *)input), iVar11 == 0)) {
      ParseProtoOption(this);
LAB_0011e043:
      *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
      if (*(char *)&(this->super_ParserState).prev_cursor_ == '\0') goto LAB_0011e050;
      goto LAB_0011dd59;
    }
    if ((*(int *)((long)&(struct_def->super_Definition).name.field_2 + 0xc) == 0x104) &&
       (iVar11 = std::__cxx11::string::compare((char *)input), iVar11 == 0)) {
      Next(this);
      *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
      if (*(char *)&(this->super_ParserState).prev_cursor_ == '\0') {
        bVar28 = false;
        uVar22 = 0;
        do {
          iVar11 = *(int *)((long)&(struct_def->super_Definition).name.field_2 + 0xc);
          if (iVar11 == 0x102) {
            local_298 = (FieldDef *)((ulong)local_298 & 0xffffffffffff0000);
            puVar24 = (ulong *)(struct_def->super_Definition).file._M_string_length;
            puVar12 = puVar24;
            if (puVar24 == (ulong *)0x0) {
              __assert_fail("s && val",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/include/flatbuffers/util.h"
                            ,0x14b,
                            "bool flatbuffers::StringToNumber(const char *, T *) [T = unsigned short]"
                           );
            }
            do {
              bVar26 = (byte)*puVar12;
              puVar12 = (ulong *)((long)puVar12 + 1);
              if (bVar26 == 0) break;
            } while (9 < (int)(char)bVar26 - 0x30U);
            if ((bVar26 == 0x30) && ((*(byte *)puVar12 & 0xdf) == 0x58)) {
              iVar11 = 0x10;
            }
            else {
              iVar11 = 10;
            }
            local_1d0._0_8_ = puVar24;
            lVar13 = strtoll_l((char *)puVar24,(char **)local_1d0,iVar11,ClassicLocale::instance_);
            if ((ulong *)local_1d0._0_8_ == puVar24 || *(byte *)local_1d0._0_8_ != 0) {
              lVar13 = 0;
            }
            if ((ulong *)local_1d0._0_8_ == puVar24 || *(byte *)local_1d0._0_8_ != 0) {
              local_298 = (FieldDef *)((ulong)(uint6)local_298._2_6_ << 0x10);
LAB_0011e16f:
              bVar6 = false;
            }
            else {
              if ((0xffff < lVar13) || (lVar13 < 0)) {
                local_298 = (FieldDef *)CONCAT62(local_298._2_6_,0xffff);
                goto LAB_0011e16f;
              }
              local_298 = (FieldDef *)CONCAT62(local_298._2_6_,(short)lVar13);
              bVar6 = true;
            }
            if (bVar6) {
              if (bVar28) {
                uVar23 = uVar22 + 1;
                local_1d0._0_2_ = uVar23;
                psVar19 = local_258;
                if (uVar23 <= (ushort)local_298._0_2_) {
                  do {
                    iVar2._M_current = *(unsigned_short **)((long)&psVar19[9].field_2 + 8);
                    if (iVar2._M_current == (unsigned_short *)psVar19[10]._M_dataplus._M_p) {
                      std::vector<unsigned_short,std::allocator<unsigned_short>>::
                      _M_realloc_insert<unsigned_short_const&>
                                ((vector<unsigned_short,std::allocator<unsigned_short>> *)
                                 local_208._16_8_,iVar2,(unsigned_short *)local_1d0);
                      psVar19 = local_258;
                    }
                    else {
                      *iVar2._M_current = uVar23;
                      *(unsigned_short **)((long)&psVar19[9].field_2 + 8) = iVar2._M_current + 1;
                    }
                    uVar23 = local_1d0._0_2_ + 1;
                    local_1d0._0_2_ = uVar23;
                  } while (uVar23 <= (ushort)local_298._0_2_);
                }
                bVar28 = false;
              }
              else {
                iVar2._M_current = *(unsigned_short **)((long)&local_258[9].field_2 + 8);
                if (iVar2._M_current == (unsigned_short *)local_258[10]._M_dataplus._M_p) {
                  std::vector<unsigned_short,std::allocator<unsigned_short>>::
                  _M_realloc_insert<unsigned_short_const&>
                            ((vector<unsigned_short,std::allocator<unsigned_short>> *)
                             local_208._16_8_,iVar2,(unsigned_short *)&local_298);
                }
                else {
                  *iVar2._M_current = local_298._0_2_;
                  *(unsigned_short **)((long)&local_258[9].field_2 + 8) = iVar2._M_current + 1;
                }
              }
              uVar22 = local_298._0_2_;
            }
            else {
              local_1d0._0_8_ = local_1d0 + 0x10;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_1d0,"Protobuf has non positive number in reserved ids","");
              Error(this,(string *)struct_def);
              if ((undefined1 *)local_1d0._0_8_ != local_1d0 + 0x10) {
                operator_delete((void *)local_1d0._0_8_,local_1d0._16_8_ + 1);
              }
            }
            if (!bVar6) break;
          }
          else if (iVar11 == 0x3b) goto LAB_0011e4e7;
          iVar11 = std::__cxx11::string::compare((char *)input);
          if (iVar11 == 0) {
            bVar28 = true;
          }
          Next(this);
          *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
          if (*(char *)&(this->super_ParserState).prev_cursor_ != '\0') break;
        } while( true );
      }
      goto LAB_0011dd59;
    }
    if ((*(int *)((long)&(struct_def->super_Definition).name.field_2 + 0xc) != 0x104) ||
       (iVar11 = std::__cxx11::string::compare((char *)input), iVar11 != 0)) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(&local_68,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_70);
      if ((char)local_23c != '\0') {
        bVar7 = true;
        bVar28 = false;
        bVar6 = false;
        goto LAB_0011e327;
      }
      if ((*(int *)((long)&(struct_def->super_Definition).name.field_2 + 0xc) == 0x104) &&
         (iVar11 = std::__cxx11::string::compare((char *)input), iVar11 == 0)) {
        Next(this);
        *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
        if (*(char *)&(this->super_ParserState).prev_cursor_ == '\0') {
LAB_0011e31c:
          bVar7 = true;
LAB_0011e322:
          bVar28 = false;
          bVar6 = false;
LAB_0011e327:
          puVar24 = (ulong *)(local_1d0 + 0x10);
          bVar27 = false;
          local_248 = (_Base_ptr)0x0;
          local_250 = (EnumDef *)0x0;
          uStack_288 = 0;
          uStack_286 = 0;
          auStack_280._0_2_ = 0;
          local_298 = (FieldDef *)0x0;
          uStack_290._0_1_ = false;
          uStack_290._1_1_ = 0;
          uStack_28e = 0;
          if (*(int *)((long)&(struct_def->super_Definition).name.field_2 + 0xc) == 0x104) {
            iVar11 = std::__cxx11::string::compare((char *)input);
            bVar27 = iVar11 == 0;
          }
          if ((bool)(bVar27 | bVar6)) {
            if (bVar6) {
              if (*(char *)((long)&struct_def[3].super_Definition.file._M_dataplus._M_p + 2) !=
                  '\x01') goto LAB_0011e425;
              ConvertCase((string *)(auStack_280 + 8),(string *)input,kUpperCamel,kSnake);
              puVar14 = (undefined8 *)std::__cxx11::string::append((char *)(auStack_280 + 8));
              puVar12 = puVar14 + 2;
              if ((ulong *)*puVar14 == puVar12) {
                local_1d0._16_8_ = *puVar12;
                local_1d0._24_8_ = puVar14[3];
                local_1d0._0_8_ = puVar24;
              }
              else {
                local_1d0._16_8_ = *puVar12;
                local_1d0._0_8_ = (ulong *)*puVar14;
              }
              local_1d0._8_8_ = puVar14[1];
              *puVar14 = puVar12;
              puVar14[1] = 0;
              *(undefined1 *)(puVar14 + 2) = 0;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_278._0_8_ != &local_268) {
                operator_delete((void *)local_278._0_8_,local_268._M_allocated_capacity + 1);
              }
              StartEnum(this,(string *)struct_def,SUB81(local_1d0,0),(EnumDef **)0x1);
              *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
              if (*(char *)&(this->super_ParserState).prev_cursor_ != '\0') goto LAB_0011f00a;
              local_298 = (FieldDef *)0x10;
              uStack_290._0_1_ = false;
              uStack_290._1_1_ = 0;
              uStack_28e = 0;
              uStack_288 = SUB82(local_250,0);
              uStack_286 = (undefined6)((ulong)local_250 >> 0x10);
            }
            else {
              Next(this);
              *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
              if (*(char *)&(this->super_ParserState).prev_cursor_ != '\0') goto LAB_0011f027;
LAB_0011e425:
              iVar11 = *(int *)&struct_def[5].fixed;
              *(int *)&struct_def[5].fixed = iVar11 + 1;
              NumToString<int>((string *)(auStack_280 + 8),iVar11);
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_1d0,"Anonymous",(string *)(auStack_280 + 8));
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_278._0_8_ != &local_268) {
                operator_delete((void *)local_278._0_8_,local_268._M_allocated_capacity + 1);
              }
              StartStruct(this,(string *)struct_def,(StructDef **)local_1d0);
              *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
              if (*(char *)&(this->super_ParserState).prev_cursor_ != '\0') {
LAB_0011f00a:
                if ((ulong *)local_1d0._0_8_ != puVar24) {
                  operator_delete((void *)local_1d0._0_8_,local_1d0._16_8_ + 1);
                }
                goto LAB_0011f027;
              }
              local_298 = (FieldDef *)0xf;
              uStack_290 = SUB82(local_248,0);
              uStack_28e = (undefined6)((ulong)local_248 >> 0x10);
              uStack_288 = 0;
              uStack_286 = 0;
            }
            auStack_280._0_2_ = 0;
            if ((ulong *)local_1d0._0_8_ != puVar24) {
              operator_delete((void *)local_1d0._0_8_,local_1d0._16_8_ + 1);
            }
          }
          else {
            ParseTypeFromProtoType(this,(Type *)struct_def);
            *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
            if (*(char *)&(this->super_ParserState).prev_cursor_ != '\0') goto LAB_0011f027;
          }
          if (bVar28) {
            uVar10 = local_298._0_4_;
            local_298 = (FieldDef *)CONCAT44(local_298._0_4_,0xe);
            if (uVar10 == 0xe) {
              local_298 = (FieldDef *)0xd0000000e;
            }
          }
          local_278._M_allocated_capacity = (size_type)&local_268;
          sVar3 = (struct_def->super_Definition).file._M_string_length;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)(auStack_280 + 8),sVar3,
                     (struct_def->super_Definition).file.field_2._M_allocated_capacity + sVar3);
          Expect(this,t);
          *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
          if (*(char *)&(this->super_ParserState).prev_cursor_ == '\0') {
            local_218 = (pointer)local_208;
            local_210 = (pointer)0x0;
            local_208[0] = 0;
            if (bVar6) {
LAB_0011e63d:
              local_2b0._16_8_ = 0;
              if ((char)local_240 != '\0') {
                cVar15 = std::
                         _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::FieldDef_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::FieldDef_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::FieldDef_*>_>_>
                         ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::FieldDef_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::FieldDef_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::FieldDef_*>_>_>
                                 *)local_78,(key_type *)(auStack_280 + 8));
                if (cVar15._M_node == local_80) {
                  local_2b0._16_8_ = 0;
                }
                else {
                  local_2b0._16_8_ = *(undefined8 *)(cVar15._M_node + 2);
                }
              }
              if (local_2b0._16_8_ == 0) {
                AddField(this,struct_def,local_258,(Type *)(auStack_280 + 8),&local_298);
                *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
                cVar21 = '\x01';
                if (*(char *)&(this->super_ParserState).prev_cursor_ == '\0') goto LAB_0011e72d;
              }
              else {
LAB_0011e72d:
                uVar5 = local_2b0._16_8_;
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::operator=((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)(local_2b0._16_8_ + 0x40),&local_68);
                if (!(bool)(~bVar6 & local_210 == (pointer)0x0)) {
                  e = (Value *)operator_new(0x48);
                  *(undefined8 *)((long)&(e->type).struct_def + 2) = 0;
                  *(undefined8 *)((long)&(e->type).enum_def + 2) = 0;
                  (e->type).base_type = BASE_TYPE_NONE;
                  (e->type).element = BASE_TYPE_NONE;
                  (e->type).struct_def = (StructDef *)0x0;
                  (e->constant)._M_dataplus._M_p = (pointer)&(e->constant).field_2;
                  *(undefined2 *)&(e->constant).field_2 = 0x30;
                  (e->constant)._M_string_length = 1;
                  e->offset = 0xffff;
                  std::__cxx11::string::_M_assign((string *)&e->constant);
                  local_1d0._0_8_ = local_1d0 + 0x10;
                  std::__cxx11::string::_M_construct<char_const*>((string *)local_1d0,"id","");
                  SymbolTable<flatbuffers::Value>::Add
                            ((SymbolTable<flatbuffers::Value> *)(uVar5 + 0x58),(string *)local_1d0,e
                            );
                  if ((undefined1 *)local_1d0._0_8_ != local_1d0 + 0x10) {
                    operator_delete((void *)local_1d0._0_8_,local_1d0._16_8_ + 1);
                  }
                }
                if (!bVar7 && 0xb < local_298._0_4_ - 1) {
                  *(undefined4 *)(uVar5 + 0x118) = 0;
                }
                if (*(int *)((long)&(struct_def->super_Definition).name.field_2 + 0xc) == 0x5b) {
                  Next(this);
                  *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
                  cVar21 = '\x01';
                  if (*(char *)&(this->super_ParserState).prev_cursor_ == '\0') {
                    do {
                      sVar3 = (struct_def->super_Definition).file._M_string_length;
                      local_1d0._0_8_ = local_1d0 + 0x10;
                      std::__cxx11::string::_M_construct<char*>
                                ((string *)local_1d0,sVar3,
                                 (struct_def->super_Definition).file.field_2._M_allocated_capacity +
                                 sVar3);
                      ParseProtoKey(this);
                      *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
                      cVar21 = '\x01';
                      if (*(char *)&(this->super_ParserState).prev_cursor_ == '\0') {
                        Expect(this,t);
                        *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
                        if (*(char *)&(this->super_ParserState).prev_cursor_ == '\0') {
                          local_2c0._0_8_ = local_2b0;
                          sVar3 = (struct_def->super_Definition).file._M_string_length;
                          std::__cxx11::string::_M_construct<char*>
                                    ((string *)local_2c0,sVar3,
                                     (struct_def->super_Definition).file.field_2.
                                     _M_allocated_capacity + sVar3);
                          ParseProtoCurliesOrIdent(this);
                          *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
                          cVar21 = '\x01';
                          if (*(char *)&(this->super_ParserState).prev_cursor_ == '\0') {
                            iVar11 = std::__cxx11::string::compare(local_1d0);
                            if (iVar11 == 0) {
                              pPVar16 = (Parser *)strpbrk((char *)local_2c0._0_8_,"0123456789-+.");
                              if ((local_298._0_4_ - 0xb < 2) &&
                                 (((iVar11 = std::__cxx11::string::compare(local_2c0), iVar11 == 0
                                   || (iVar11 = std::__cxx11::string::compare(local_2c0),
                                      iVar11 == 0)) ||
                                  (iVar11 = std::__cxx11::string::compare(local_2c0), iVar11 == 0)))
                                 ) {
                                iVar11 = std::__cxx11::string::compare(local_2c0);
                                p_Var1 = (_Base_ptr)(local_238 + 0x10);
                                local_238._0_8_ = p_Var1;
                                if (iVar11 == 0) {
                                  std::__cxx11::string::_M_construct<char_const*>
                                            ((string *)local_238,"+inf","");
                                }
                                else {
                                  std::__cxx11::string::_M_construct<char*>
                                            ((string *)local_238,local_2c0._0_8_,
                                             (char *)(local_2c0._0_8_ +
                                                     (long)(Definition *)local_2c0._8_8_));
                                }
                                std::__cxx11::string::operator=
                                          ((string *)(local_2b0._16_8_ + 0xe8),(string *)local_238);
                                if ((_Base_ptr)local_238._0_8_ != p_Var1) {
                                  operator_delete((void *)local_238._0_8_,local_238._16_8_ + 1);
                                }
                              }
                              else if (((local_298._0_4_ - 1 < 0xc) &&
                                       (pPVar16 == (Parser *)local_2c0._0_8_)) ||
                                      (iVar11 = std::__cxx11::string::compare(local_2c0),
                                      iVar11 == 0)) {
                                std::__cxx11::string::_M_assign((string *)(local_2b0._16_8_ + 0xe8))
                                ;
                              }
                            }
                            else {
                              iVar11 = std::__cxx11::string::compare(local_1d0);
                              if (iVar11 == 0) {
                                iVar11 = std::__cxx11::string::compare(local_2c0);
                                *(bool *)(local_2b0._16_8_ + 0x110) = iVar11 == 0;
                              }
                            }
                            cVar21 = '\t';
                            if (*(int *)((long)&(struct_def->super_Definition).name.field_2 + 0xc)
                                == 0x2c) {
                              Next(this);
                              *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1
                              ;
                              cVar21 = *(char *)&(this->super_ParserState).prev_cursor_;
                            }
                          }
                          if ((Parser *)local_2c0._0_8_ != (Parser *)local_2b0) {
                            operator_delete((void *)local_2c0._0_8_,(ulong)(local_2b0._0_8_ + 1));
                          }
                        }
                      }
                      if ((undefined1 *)local_1d0._0_8_ != local_1d0 + 0x10) {
                        operator_delete((void *)local_1d0._0_8_,local_1d0._16_8_ + 1);
                      }
                    } while (cVar21 == '\0');
                    if (cVar21 == '\t') {
                      Expect(this,t);
                      *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
                      cVar21 = '\x01';
                      if (*(char *)&(this->super_ParserState).prev_cursor_ == '\0')
                      goto LAB_0011eb0a;
                    }
                  }
                }
                else {
LAB_0011eb0a:
                  if (local_248 == (_Base_ptr)0x0) {
                    if (local_250 == (EnumDef *)0x0) {
                      Expect(this,t);
                      *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
LAB_0011ecdc:
                      cVar21 = '\x01';
                      if (*(char *)&(this->super_ParserState).prev_cursor_ == '\0')
                      goto LAB_0011ece1;
                    }
                    else {
                      local_1d0._0_8_ = local_1d0 + 0x10;
                      local_1d0._8_8_ = (_Base_ptr)0x0;
                      local_1d0._16_8_ = local_1d0._16_8_ & 0xffffffffffffff00;
                      local_1d0._32_8_ = local_1d0 + 0x30;
                      local_1d0._40_8_ = (_Base_ptr)0x0;
                      local_1a0._M_local_buf[0] = false;
                      local_180 = (pointer)0x0;
                      local_190 = (pointer)0x0;
                      _Stack_188._M_t.
                      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      .
                      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                      ._M_head_impl =
                           (tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )(_Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              )0x0;
                      local_170._M_color = _S_red;
                      local_170._M_parent = (_Base_ptr)0x0;
                      local_170._M_left = (_Base_ptr)(local_1d0 + 0x60);
                      local_128 = (Namespace *)0x0;
                      local_120 = 0;
                      local_130 = false;
                      local_140 = (pointer)0x0;
                      ppSStack_138 = (pointer)0x0;
                      local_150 = 0;
                      ppSStack_148 = (pointer)0x0;
                      local_11c._0_4_ = -1;
                      local_11c._4_4_ = 1;
                      local_110 = (string *)0x0;
                      local_100._0_4_ = _S_red;
                      local_100._8_8_ = (_Base_ptr)0x0;
                      local_100._16_8_ = local_88;
                      local_e8 = local_88;
                      local_c0 = false;
                      local_d0 = (pointer)0x0;
                      ppFStack_c8 = (pointer)0x0;
                      local_e0 = 0;
                      ppFStack_d8 = (pointer)0x0;
                      local_bf._0_1_ = true;
                      local_bf._1_1_ = true;
                      local_bd = false;
                      local_b8 = 1;
                      local_90 = (pointer)0x0;
                      local_a0 = (pointer)0x0;
                      puStack_98 = (pointer)0x0;
                      local_b0 = (uint8_t *)0x0;
                      _Stack_a8._M_t.
                      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      .
                      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                      ._M_head_impl =
                           (tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )(_Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              )0x0;
                      local_170._M_right = local_170._M_left;
                      ParseProtoFields(this,struct_def,SUB81(local_1d0,0),false);
                      *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
                      cVar21 = '\x01';
                      if (*(char *)&(this->super_ParserState).prev_cursor_ == '\0') {
                        if (*(int *)((long)&(struct_def->super_Definition).name.field_2 + 0xc) ==
                            0x3b) {
                          Next(this);
                          *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
                          if (*(char *)&(this->super_ParserState).prev_cursor_ != '\0')
                          goto LAB_0011ecac;
                        }
                        ppFVar25 = ppFStack_d8;
                        if (ppFStack_d8 == local_d0) {
                          cVar21 = '\0';
                          bVar26 = 1;
                        }
                        else {
                          do {
                            __rhs = *ppFVar25;
                            if ((((__rhs->value).type.base_type != BASE_TYPE_STRUCT) ||
                                (pSVar4 = (__rhs->value).type.struct_def, pSVar4 == (StructDef *)0x0
                                )) || (pSVar4->fixed == true)) {
                              std::operator+(&local_50,"oneof \'",
                                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                              *)(auStack_280 + 8));
                              plVar18 = (long *)std::__cxx11::string::append((char *)&local_50);
                              local_208._24_8_ = &local_1e0;
                              paVar20 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                         *)(plVar18 + 2);
                              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                   *)*plVar18 == paVar20) {
                                local_1e0._M_allocated_capacity = paVar20->_M_allocated_capacity;
                                local_1e0._8_8_ = plVar18[3];
                              }
                              else {
                                local_1e0._M_allocated_capacity = paVar20->_M_allocated_capacity;
                                local_208._24_8_ =
                                     (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                      *)*plVar18;
                              }
                              local_1e8 = (_Base_ptr)plVar18[1];
                              *plVar18 = (long)paVar20;
                              plVar18[1] = 0;
                              *(undefined1 *)(plVar18 + 2) = 0;
                              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                              *)local_238,
                                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                              *)(local_208 + 0x18),
                                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                              *)__rhs);
                              plVar18 = (long *)std::__cxx11::string::append((char *)local_238);
                              local_2c0._0_8_ = local_2b0;
                              pPVar16 = (Parser *)(plVar18 + 2);
                              if ((Parser *)*plVar18 == pPVar16) {
                                local_2b0._0_8_ =
                                     (((Definition *)&pPVar16->super_ParserState)->name)._M_dataplus
                                     ._M_p;
                                local_2b0._8_8_ = plVar18[3];
                              }
                              else {
                                local_2b0._0_8_ =
                                     (((Definition *)&pPVar16->super_ParserState)->name)._M_dataplus
                                     ._M_p;
                                local_2c0._0_8_ = (Parser *)*plVar18;
                              }
                              local_2c0._8_8_ = plVar18[1];
                              *plVar18 = (long)pPVar16;
                              plVar18[1] = 0;
                              *(undefined1 *)(plVar18 + 2) = 0;
                              Error(this,(string *)struct_def);
                              if ((Parser *)local_2c0._0_8_ != (Parser *)local_2b0) {
                                operator_delete((void *)local_2c0._0_8_,(ulong)(local_2b0._0_8_ + 1)
                                               );
                              }
                              if ((_Base_ptr)local_238._0_8_ != (_Base_ptr)(local_238 + 0x10)) {
                                operator_delete((void *)local_238._0_8_,local_238._16_8_ + 1);
                              }
                              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                   *)local_208._24_8_ != &local_1e0) {
                                operator_delete((void *)local_208._24_8_,
                                                local_1e0._M_allocated_capacity + 1);
                              }
                              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                   *)local_50._M_dataplus._M_p != &local_50.field_2) {
                                operator_delete(local_50._M_dataplus._M_p,
                                                local_50.field_2._M_allocated_capacity + 1);
                              }
                              goto LAB_0011ecac;
                            }
                            local_2c0._8_8_ = local_250;
                            local_2b0._0_8_ = (pointer)0x0;
                            local_2b0._8_8_ = local_2b0._8_8_ & 0xffffffffffffff00;
                            local_2c0._0_8_ = struct_def;
                            pEVar17 = EnumValBuilder::CreateEnumerator
                                                ((EnumValBuilder *)local_2c0,(string *)pSVar4);
                            BVar8 = (__rhs->value).type.base_type;
                            BVar9 = (__rhs->value).type.element;
                            pSVar4 = (__rhs->value).type.struct_def;
                            uVar5 = *(undefined8 *)((long)&(__rhs->value).type.enum_def + 2);
                            *(undefined8 *)((long)&(pEVar17->union_type).struct_def + 2) =
                                 *(undefined8 *)((long)&(__rhs->value).type.struct_def + 2);
                            *(undefined8 *)((long)&(pEVar17->union_type).enum_def + 2) = uVar5;
                            (pEVar17->union_type).base_type = BVar8;
                            (pEVar17->union_type).element = BVar9;
                            (pEVar17->union_type).struct_def = pSVar4;
                            std::
                            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ::operator=(&pEVar17->doc_comment,&(__rhs->super_Definition).doc_comment
                                       );
                            EnumValBuilder::AcceptEnumerator
                                      ((EnumValBuilder *)this,(string *)local_2c0);
                            *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
                            bVar26 = *(byte *)&(this->super_ParserState).prev_cursor_;
                            EnumValBuilder::~EnumValBuilder((EnumValBuilder *)local_2c0);
                            if (bVar26 != 0) {
                              cVar21 = '\x01';
                              goto LAB_0011efdf;
                            }
                            ppFVar25 = ppFVar25 + 1;
                          } while (ppFVar25 != local_d0);
                          cVar21 = '\0';
LAB_0011efdf:
                          bVar26 = bVar26 ^ 1;
                        }
                      }
                      else {
LAB_0011ecac:
                        bVar26 = 0;
                      }
                      StructDef::~StructDef((StructDef *)local_1d0);
                      if (bVar26 != 0) goto LAB_0011ece1;
                    }
                  }
                  else {
                    ParseProtoFields(this,struct_def,SUB81(local_248,0),false);
                    *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
                    cVar21 = '\x01';
                    if (*(char *)&(this->super_ParserState).prev_cursor_ == '\0') {
                      if (*(int *)((long)&(struct_def->super_Definition).name.field_2 + 0xc) == 0x3b
                         ) {
                        Next(this);
                        *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
                        goto LAB_0011ecdc;
                      }
LAB_0011ece1:
                      cVar21 = '\0';
                    }
                  }
                }
              }
              bVar28 = cVar21 == '\0';
            }
            else {
              Expect(this,t);
              *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
              if (*(char *)&(this->super_ParserState).prev_cursor_ == '\0') {
                std::__cxx11::string::_M_assign((string *)&local_218);
                Expect(this,t);
                *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
                if (*(char *)&(this->super_ParserState).prev_cursor_ == '\0') goto LAB_0011e63d;
              }
              bVar28 = false;
            }
            if (local_218 != (pointer)local_208) {
              operator_delete(local_218,CONCAT71(local_208._1_7_,local_208[0]) + 1);
            }
          }
          else {
            bVar28 = false;
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_278._0_8_ != &local_268) {
            operator_delete((void *)local_278._0_8_,local_268._M_allocated_capacity + 1);
          }
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&local_68);
          if (!bVar28) goto LAB_0011dd59;
          goto LAB_0011ddcd;
        }
      }
      else if ((*(int *)((long)&(struct_def->super_Definition).name.field_2 + 0xc) == 0x104) &&
              (iVar11 = std::__cxx11::string::compare((char *)input), iVar11 == 0)) {
        Next(this);
        *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
        if (*(char *)&(this->super_ParserState).prev_cursor_ == '\0') {
          bVar7 = false;
          goto LAB_0011e322;
        }
      }
      else if ((*(int *)((long)&(struct_def->super_Definition).name.field_2 + 0xc) == 0x104) &&
              (iVar11 = std::__cxx11::string::compare((char *)input), iVar11 == 0)) {
        Next(this);
        *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
        if (*(char *)&(this->super_ParserState).prev_cursor_ == '\0') {
          bVar7 = true;
          bVar6 = false;
          bVar28 = true;
          goto LAB_0011e327;
        }
      }
      else {
        if ((*(int *)((long)&(struct_def->super_Definition).name.field_2 + 0xc) != 0x104) ||
           (iVar11 = std::__cxx11::string::compare((char *)input), iVar11 != 0)) goto LAB_0011e31c;
        Next(this);
        *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
        if (*(char *)&(this->super_ParserState).prev_cursor_ == '\0') {
          bVar7 = true;
          bVar28 = false;
          bVar6 = true;
          goto LAB_0011e327;
        }
      }
LAB_0011f027:
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_68);
      goto LAB_0011dd59;
    }
    ParseProtoMapField(this,struct_def);
  }
LAB_0011e4f2:
  *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
  if (*(char *)&(this->super_ParserState).prev_cursor_ != '\0') goto LAB_0011dd59;
  goto LAB_0011ddcd;
LAB_0011e4e7:
  Next(this);
  goto LAB_0011e4f2;
}

Assistant:

CheckedError Parser::ParseProtoFields(StructDef *struct_def, bool isextend,
                                      bool inside_oneof) {
  EXPECT('{');
  while (token_ != '}') {
    if (IsIdent("message") || IsIdent("extend") || IsIdent("enum")) {
      // Nested declarations.
      ECHECK(ParseProtoDecl());
    } else if (IsIdent("extensions")) {  // Skip these.
      NEXT();
      EXPECT(kTokenIntegerConstant);
      if (Is(kTokenIdentifier)) {
        NEXT();  // to
        NEXT();  // num
      }
      EXPECT(';');
    } else if (IsIdent("option")) {  // Skip these.
      ECHECK(ParseProtoOption());
      EXPECT(';');
    } else if (IsIdent("reserved")) {  // Skip these.
      /**
       * Reserved proto ids can be comma seperated (e.g. 1,2,4,5;)
       * or range based (e.g. 9 to 11;)
       * or combination of them (e.g. 1,2,9 to 11,4,5;)
       * It will be ended by a semicolon.
       */
      NEXT();
      bool range = false;
      voffset_t from = 0;

      while (!Is(';')) {
        if (token_ == kTokenIntegerConstant) {
          voffset_t attribute = 0;
          bool done = StringToNumber(attribute_.c_str(), &attribute);
          if (!done)
            return Error("Protobuf has non positive number in reserved ids");

          if (range) {
            for (voffset_t id = from + 1; id <= attribute; id++)
              struct_def->reserved_ids.push_back(id);

            range = false;
          } else {
            struct_def->reserved_ids.push_back(attribute);
          }

          from = attribute;
        }

        if (attribute_ == "to") range = true;

        NEXT();
      }  // A variety of formats, just skip.

      NEXT();
    } else if (IsIdent("map")) {
      ECHECK(ParseProtoMapField(struct_def));
    } else {
      std::vector<std::string> field_comment = doc_comment_;
      // Parse the qualifier.
      bool required = false;
      bool repeated = false;
      bool oneof = false;
      if (!inside_oneof) {
        if (IsIdent("optional")) {
          // This is the default.
          NEXT();
        } else if (IsIdent("required")) {
          required = true;
          NEXT();
        } else if (IsIdent("repeated")) {
          repeated = true;
          NEXT();
        } else if (IsIdent("oneof")) {
          oneof = true;
          NEXT();
        } else {
          // can't error, proto3 allows decls without any of the above.
        }
      }
      StructDef *anonymous_struct = nullptr;
      EnumDef *oneof_union = nullptr;
      Type type;
      if (IsIdent("group") || oneof) {
        if (!oneof) NEXT();
        if (oneof && opts.proto_oneof_union) {
          auto name = ConvertCase(attribute_, Case::kUpperCamel) + "Union";
          ECHECK(StartEnum(name, true, &oneof_union));
          type = Type(BASE_TYPE_UNION, nullptr, oneof_union);
        } else {
          auto name = "Anonymous" + NumToString(anonymous_counter_++);
          ECHECK(StartStruct(name, &anonymous_struct));
          type = Type(BASE_TYPE_STRUCT, anonymous_struct);
        }
      } else {
        ECHECK(ParseTypeFromProtoType(&type));
      }
      // Repeated elements get mapped to a vector.
      if (repeated) {
        type.element = type.base_type;
        type.base_type = BASE_TYPE_VECTOR;
        if (type.element == BASE_TYPE_VECTOR) {
          // We have a vector or vectors, which FlatBuffers doesn't support.
          // For now make it a vector of string (since the source is likely
          // "repeated bytes").
          // TODO(wvo): A better solution would be to wrap this in a table.
          type.element = BASE_TYPE_STRING;
        }
      }
      std::string name = attribute_;
      EXPECT(kTokenIdentifier);
      std::string proto_field_id;
      if (!oneof) {
        // Parse the field id. Since we're just translating schemas, not
        // any kind of binary compatibility, we can safely ignore these, and
        // assign our own.
        EXPECT('=');
        proto_field_id = attribute_;
        EXPECT(kTokenIntegerConstant);
      }
      FieldDef *field = nullptr;
      if (isextend) {
        // We allow a field to be re-defined when extending.
        // TODO: are there situations where that is problematic?
        field = struct_def->fields.Lookup(name);
      }
      if (!field) ECHECK(AddField(*struct_def, name, type, &field));
      field->doc_comment = field_comment;
      if (!proto_field_id.empty() || oneof) {
        auto val = new Value();
        val->constant = proto_field_id;
        field->attributes.Add("id", val);
      }
      if (!IsScalar(type.base_type) && required) {
        field->presence = FieldDef::kRequired;
      }
      // See if there's a default specified.
      if (Is('[')) {
        NEXT();
        for (;;) {
          auto key = attribute_;
          ECHECK(ParseProtoKey());
          EXPECT('=');
          auto val = attribute_;
          ECHECK(ParseProtoCurliesOrIdent());
          if (key == "default") {
            // Temp: skip non-numeric and non-boolean defaults (enums).
            auto numeric = strpbrk(val.c_str(), "0123456789-+.");
            if (IsFloat(type.base_type) &&
                (val == "inf" || val == "+inf" || val == "-inf")) {
              // Prefer to be explicit with +inf.
              field->value.constant = val == "inf" ? "+inf" : val;
            } else if (IsScalar(type.base_type) && numeric == val.c_str()) {
              field->value.constant = val;
            } else if (val == "true") {
              field->value.constant = val;
            }  // "false" is default, no need to handle explicitly.
          } else if (key == "deprecated") {
            field->deprecated = val == "true";
          }
          if (!Is(',')) break;
          NEXT();
        }
        EXPECT(']');
      }
      if (anonymous_struct) {
        ECHECK(ParseProtoFields(anonymous_struct, false, oneof));
        if (Is(';')) NEXT();
      } else if (oneof_union) {
        // Parse into a temporary StructDef, then transfer fields into an
        // EnumDef describing the oneof as a union.
        StructDef oneof_struct;
        ECHECK(ParseProtoFields(&oneof_struct, false, oneof));
        if (Is(';')) NEXT();
        for (auto field_it = oneof_struct.fields.vec.begin();
             field_it != oneof_struct.fields.vec.end(); ++field_it) {
          const auto &oneof_field = **field_it;
          const auto &oneof_type = oneof_field.value.type;
          if (oneof_type.base_type != BASE_TYPE_STRUCT ||
              !oneof_type.struct_def || oneof_type.struct_def->fixed)
            return Error("oneof '" + name +
                         "' cannot be mapped to a union because member '" +
                         oneof_field.name + "' is not a table type.");
          EnumValBuilder evb(*this, *oneof_union);
          auto ev = evb.CreateEnumerator(oneof_type.struct_def->name);
          ev->union_type = oneof_type;
          ev->doc_comment = oneof_field.doc_comment;
          ECHECK(evb.AcceptEnumerator(oneof_field.name));
        }
      } else {
        EXPECT(';');
      }
    }
  }
  NEXT();
  return NoError();
}